

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddImage.c
# Opt level: O1

Extra_ImageNode_t *
Extra_CombineTwoNodes
          (DdManager *dd,DdNode *bCube,Extra_ImageNode_t *pNode1,Extra_ImageNode_t *pNode2)

{
  int iVar1;
  Extra_ImagePart_t *pEVar2;
  DdNode *pDVar3;
  Extra_ImageNode_t *pEVar4;
  
  pEVar2 = (Extra_ImagePart_t *)malloc(0x18);
  pEVar2->bFunc = (DdNode *)0x0;
  pEVar2->bSupp = (DdNode *)0x0;
  pEVar2->nNodes = 0;
  pEVar2->nSupp = 0;
  pEVar2->iPart = 0;
  pDVar3 = Cudd_bddAndAbstract(dd,pNode1->pPart->bFunc,pNode2->pPart->bFunc,bCube);
  pEVar2->bFunc = pDVar3;
  Cudd_Ref(pDVar3);
  pDVar3 = Cudd_bddAndAbstract(dd,pNode1->pPart->bSupp,pNode2->pPart->bSupp,bCube);
  pEVar2->bSupp = pDVar3;
  Cudd_Ref(pDVar3);
  iVar1 = Extra_bddSuppSize(dd,pEVar2->bSupp);
  pEVar2->nSupp = (short)iVar1;
  iVar1 = Cudd_DagSize(pEVar2->bFunc);
  pEVar2->nNodes = iVar1;
  pEVar2->iPart = -1;
  pEVar4 = (Extra_ImageNode_t *)malloc(0x30);
  pEVar4->dd = (DdManager *)0x0;
  pEVar4->bCube = (DdNode *)0x0;
  pEVar4->pNode2 = (Extra_ImageNode_t *)0x0;
  pEVar4->pPart = (Extra_ImagePart_t *)0x0;
  pEVar4->bImage = (DdNode *)0x0;
  pEVar4->pNode1 = (Extra_ImageNode_t *)0x0;
  pEVar4->dd = dd;
  pEVar4->pPart = pEVar2;
  pEVar4->pNode1 = pNode1;
  pEVar4->pNode2 = pNode2;
  pDVar3 = Cudd_bddAndAbstract(dd,pNode1->bImage,pNode2->bImage,bCube);
  pEVar4->bImage = pDVar3;
  Cudd_Ref(pDVar3);
  if (dd->one != bCube) {
    pEVar4->bCube = bCube;
    Cudd_Ref(bCube);
  }
  return pEVar4;
}

Assistant:

Extra_ImageNode_t * Extra_CombineTwoNodes( DdManager * dd, DdNode * bCube,
    Extra_ImageNode_t * pNode1, Extra_ImageNode_t * pNode2 )
{
    Extra_ImageNode_t * pNode;
    Extra_ImagePart_t * pPart;

    // create a new partition
    pPart = ABC_ALLOC( Extra_ImagePart_t, 1 );
    memset( pPart, 0, sizeof(Extra_ImagePart_t) );
    // create the function
    pPart->bFunc = Cudd_bddAndAbstract( dd, pNode1->pPart->bFunc, pNode2->pPart->bFunc, bCube );
    Cudd_Ref( pPart->bFunc );
    // update the support the partition
    pPart->bSupp = Cudd_bddAndAbstract( dd, pNode1->pPart->bSupp, pNode2->pPart->bSupp, bCube );
    Cudd_Ref( pPart->bSupp );
    // update the numbers
    pPart->nSupp  = Extra_bddSuppSize( dd, pPart->bSupp );
    pPart->nNodes = Cudd_DagSize( pPart->bFunc );
    pPart->iPart = -1;
/*
ABC_PRB( dd, pNode1->pPart->bSupp );
ABC_PRB( dd, pNode2->pPart->bSupp );
ABC_PRB( dd, pPart->bSupp );
*/
    // create a new node
    pNode = ABC_ALLOC( Extra_ImageNode_t, 1 );
    memset( pNode, 0, sizeof(Extra_ImageNode_t) );
    pNode->dd     = dd;
    pNode->pPart  = pPart;
    pNode->pNode1 = pNode1;
    pNode->pNode2 = pNode2;
    // compute the image
    pNode->bImage = Cudd_bddAndAbstract( dd, pNode1->bImage, pNode2->bImage, bCube ); 
    Cudd_Ref( pNode->bImage );
    // save the cube
    if ( bCube != b1 )
    {
        pNode->bCube = bCube;   Cudd_Ref( bCube );
    }
    return pNode;
}